

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Iterator * __thiscall
leveldb::TableCache::NewIterator
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,
          Table **tableptr)

{
  Table *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Iterator *result;
  Table *table;
  undefined1 local_48 [8];
  Status s;
  Handle *handle;
  Table **tableptr_local;
  uint64_t file_size_local;
  uint64_t file_number_local;
  ReadOptions *options_local;
  TableCache *this_local;
  
  if (tableptr != (Table **)0x0) {
    *tableptr = (Table *)0x0;
  }
  s.state_ = (char *)0x0;
  FindTable((TableCache *)local_48,(uint64_t)this,file_number,(Handle **)file_size);
  bVar1 = Status::ok((Status *)local_48);
  if (bVar1) {
    iVar2 = (*this->cache_->_vptr_Cache[5])(this->cache_,s.state_);
    this_00 = *(Table **)(CONCAT44(extraout_var,iVar2) + 8);
    this_local = (TableCache *)Table::NewIterator(this_00,options);
    Iterator::RegisterCleanup((Iterator *)this_local,UnrefEntry,this->cache_,s.state_);
    if (tableptr != (Table **)0x0) {
      *tableptr = this_00;
    }
  }
  else {
    this_local = (TableCache *)NewErrorIterator((Status *)local_48);
  }
  Status::~Status((Status *)local_48);
  return (Iterator *)this_local;
}

Assistant:

Iterator* TableCache::NewIterator(const ReadOptions& options,
                                  uint64_t file_number, uint64_t file_size,
                                  Table** tableptr) {
  if (tableptr != nullptr) {
    *tableptr = nullptr;
  }

  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (!s.ok()) {
    return NewErrorIterator(s);
  }

  Table* table = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
  Iterator* result = table->NewIterator(options);
  result->RegisterCleanup(&UnrefEntry, cache_, handle);
  if (tableptr != nullptr) {
    *tableptr = table;
  }
  return result;
}